

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_smod(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint uVar1;
  BtorSimBitVector *bv;
  ulong uVar2;
  BtorSimBitVector *pBVar3;
  BtorSimBitVector *pBVar4;
  BtorSimBitVector *__ptr;
  BtorSimBitVector *__ptr_00;
  BtorSimBitVector *a_00;
  BtorSimBitVector *b_00;
  ulong uVar5;
  BtorSimBitVector *b_01;
  BtorSimBitVector *__ptr_01;
  BtorSimBitVector *pBVar6;
  uint32_t uVar7;
  ulong uVar8;
  BtorSimBitVector *pBVar9;
  byte bVar10;
  byte bVar11;
  BtorSimBitVector *res;
  BtorSimBitVector *local_38;
  
  if (a->width == 1) {
    pBVar3 = btorsim_bv_not(b);
    pBVar4 = btorsim_bv_and(a,pBVar3);
    free(pBVar3);
    return pBVar4;
  }
  uVar7 = a->width - 1;
  pBVar3 = btorsim_bv_slice(a,uVar7,uVar7);
  uVar7 = b->width - 1;
  pBVar4 = btorsim_bv_slice(b,uVar7,uVar7);
  if (pBVar3->width == 1) {
    bVar11 = (byte)(&pBVar3[1].width)[pBVar3->len - 1] & 1;
  }
  else {
    bVar11 = 0;
  }
  if (pBVar4->width == 1) {
    bVar10 = (byte)(&pBVar4[1].width)[pBVar4->len - 1] & 1;
  }
  else {
    bVar10 = 0;
  }
  __ptr = btorsim_bv_neg(a);
  __ptr_00 = btorsim_bv_neg(b);
  if (bVar11 != 0) {
    a = __ptr;
  }
  a_00 = btorsim_bv_new(a->width);
  memcpy(a_00 + 1,a + 1,(ulong)a->len << 2);
  pBVar9 = b;
  if (bVar10 != 0) {
    pBVar9 = __ptr_00;
  }
  b_00 = btorsim_bv_new(pBVar9->width);
  memcpy(b_00 + 1,pBVar9 + 1,(ulong)pBVar9->len << 2);
  local_38 = (BtorSimBitVector *)0x0;
  udiv_urem_bv(a_00,b_00,(BtorSimBitVector **)0x0,&local_38);
  bv = local_38;
  pBVar9 = local_38 + 1;
  uVar5 = (ulong)local_38->len;
  if (uVar5 == 0) {
LAB_0011566c:
    b_01 = btorsim_bv_new(b->width);
  }
  else {
    if (pBVar9->width == 0) {
      uVar2 = 1;
      do {
        uVar8 = uVar2;
        if (uVar5 == uVar8) break;
        uVar2 = uVar8 + 1;
      } while ((&local_38[1].width)[uVar8] == 0);
      if (uVar5 <= uVar8) goto LAB_0011566c;
    }
    b_01 = btorsim_bv_new(b->width);
    memcpy(b_01 + 1,b + 1,(ulong)b->len << 2);
  }
  __ptr_01 = btorsim_bv_neg(bv);
  if (bVar11 == 0 && bVar10 == 0) {
    pBVar6 = btorsim_bv_new(bv->width);
    uVar1 = bv->len;
  }
  else {
    pBVar9 = __ptr_01;
    if (((~bVar11 & 1) == 0 && bVar10 == 0) || (pBVar9 = bv, bVar11 == 0 && (~bVar10 & 1) == 0)) {
      pBVar6 = btorsim_bv_add(pBVar9,b_01);
      goto LAB_001156fb;
    }
    pBVar6 = btorsim_bv_new(__ptr_01->width);
    pBVar9 = __ptr_01 + 1;
    uVar1 = __ptr_01->len;
  }
  memcpy(pBVar6 + 1,pBVar9,(ulong)uVar1 << 2);
LAB_001156fb:
  free(pBVar3);
  free(pBVar4);
  free(__ptr);
  free(__ptr_00);
  free(a_00);
  free(b_00);
  free(bv);
  free(b_01);
  free(__ptr_01);
  return pBVar6;
}

Assistant:

BtorSimBitVector *
btorsim_bv_smod (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_b, *sign_a, *sign_b, *neg_a, *neg_b, *add;
  BtorSimBitVector *cond_a, *cond_b, *urem, *neg_urem;
  bool a_positive, b_positive;

  if (a->width == 1)
  {
    not_b = btorsim_bv_not (b);
    res   = btorsim_bv_and (a, not_b);
    btorsim_bv_free (not_b);
  }
  else
  {
    sign_a = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    a_positive = !btorsim_bv_is_true (sign_a);
    b_positive = !btorsim_bv_is_true (sign_b);

    neg_a  = btorsim_bv_neg (a);
    neg_b  = btorsim_bv_neg (b);
    cond_a = a_positive ? btorsim_bv_copy (a)
                        : btorsim_bv_copy (neg_a);
    cond_b = b_positive ? btorsim_bv_copy (b)
                        : btorsim_bv_copy (neg_b);


    urem     = btorsim_bv_urem (cond_a, cond_b);
    add = btorsim_bv_is_zero(urem) ? btorsim_bv_zero(b->width)
                                   : btorsim_bv_copy(b);

    neg_urem = btorsim_bv_neg (urem);

    res =  a_positive &&  b_positive ? btorsim_bv_copy(urem)
        : !a_positive &&  b_positive ? btorsim_bv_add(neg_urem, add)
        :  a_positive && !b_positive ? btorsim_bv_add(urem, add)
                                     : btorsim_bv_copy(neg_urem);

    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (urem);
    btorsim_bv_free (add);
    btorsim_bv_free (neg_urem);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}